

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase957::run(TestCase957 *this)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar2;
  void *pvVar3;
  PromiseBase PVar4;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:980:13)>
  *location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1a0;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:976:37),_void>
  ignore;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_190;
  anon_class_8_1_bc7188dc_for_func local_188;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_180;
  void *continuationTracePtr;
  uint *local_170;
  char *local_168;
  size_t local_160;
  bool local_158;
  int counter;
  anon_class_8_1_bc7188dc_for_func local_148;
  char *local_140;
  char *pcStack_138;
  undefined8 local_130;
  char *local_128;
  char *pcStack_120;
  undefined8 local_118;
  WaitScope waitScope;
  ErrorHandlerImpl errorHandler;
  TaskSet tasks;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  errorHandler.super_ErrorHandler._vptr_ErrorHandler = (_func_int **)&PTR_taskFailed_00579dd8;
  errorHandler.exceptionCount = 0;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_120 = "run";
  local_118 = 0xb000003c1;
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x3c1;
  location.columnNumber = 0xb;
  TaskSet::TaskSet(&tasks,&errorHandler.super_ErrorHandler,location);
  counter = 0;
  local_188.counter = &counter;
  yield();
  OVar2.ptr = local_1a0.ptr;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:965:23)>
       ::anon_class_8_1_bc7188dc_for_func::operator();
  pPVar1 = ((local_1a0.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_1a0.ptr - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    PVar4.node.ptr = (OwnPromiseNode)((long)pvVar3 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase957::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase957::run()::__0,void*&>
              ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:965:23)>
                *)PVar4.node.ptr,&local_1a0,&local_188,&continuationTracePtr);
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((local_1a0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    PVar4.node.ptr = (OwnPromiseNode)&local_1a0.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase957::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase957::run()::__0,void*&>
              ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:965:23)>
                *)PVar4.node.ptr,&local_1a0,&local_188,&continuationTracePtr);
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_190.ptr = (PromiseNode *)0x0;
  local_180.ptr = (PromiseNode *)0x0;
  ignore.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar4.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_180);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_190);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1a0);
  TaskSet::add(&tasks,&ignore);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&ignore);
  local_188.counter = &counter;
  yield();
  OVar2.ptr = local_1a0.ptr;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:968:23)>
       ::anon_class_8_1_bc7188dc_for_func::operator();
  pPVar1 = ((local_1a0.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_1a0.ptr - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    PVar4.node.ptr = (OwnPromiseNode)((long)pvVar3 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase957::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase957::run()::__1,void*&>
              ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:968:23)>
                *)PVar4.node.ptr,&local_1a0,(anon_class_8_1_bc7188dc_for_func *)&local_188,
               &continuationTracePtr);
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((local_1a0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    PVar4.node.ptr = (OwnPromiseNode)&local_1a0.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase957::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase957::run()::__1,void*&>
              ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:968:23)>
                *)PVar4.node.ptr,&local_1a0,(anon_class_8_1_bc7188dc_for_func *)&local_188,
               &continuationTracePtr);
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_190.ptr = (PromiseNode *)0x0;
  local_180.ptr = (PromiseNode *)0x0;
  ignore.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar4.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_180);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_190);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1a0);
  TaskSet::add(&tasks,&ignore);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&ignore);
  local_188.counter = &counter;
  yield();
  OVar2.ptr = local_1a0.ptr;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:972:23)>
       ::anon_class_8_1_bc7188dc_for_func::operator();
  pPVar1 = ((local_1a0.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_1a0.ptr - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    PVar4.node.ptr = (OwnPromiseNode)((long)pvVar3 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase957::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase957::run()::__2,void*&>
              ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:972:23)>
                *)PVar4.node.ptr,&local_1a0,(anon_class_8_1_bc7188dc_for_func *)&local_188,
               &continuationTracePtr);
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((local_1a0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    PVar4.node.ptr = (OwnPromiseNode)&local_1a0.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase957::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase957::run()::__2,void*&>
              ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:972:23)>
                *)PVar4.node.ptr,&local_1a0,(anon_class_8_1_bc7188dc_for_func *)&local_188,
               &continuationTracePtr);
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_190.ptr = (PromiseNode *)0x0;
  local_180.ptr = (PromiseNode *)0x0;
  ignore.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar4.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_180);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_190);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1a0);
  TaskSet::add(&tasks,&ignore);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&ignore);
  yield();
  OVar2.ptr = local_180.ptr;
  pPVar1 = ((local_180.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_180.ptr - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    PVar4.node.ptr = (OwnPromiseNode)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar4.node.ptr,&local_180,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:976:37)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_00579f10;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((local_180.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    PVar4.node.ptr = (OwnPromiseNode)&local_180.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar4.node.ptr,&local_180,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:976:37)>
               ::anon_class_1_0_00000001_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_00579f10;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  continuationTracePtr = (void *)0x0;
  local_190.ptr = (PromiseNode *)0x0;
  ignore.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar4.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_190);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_180);
  local_148.counter = &counter;
  yield();
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:980:13)>
       ::anon_class_8_1_bc7188dc_for_func::operator();
  pPVar1 = ((local_1a0.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_1a0.ptr - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:980:13)>
                   *)((long)pvVar3 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase957::run()::__4>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase957::run()::__4,void*&>
              (location_00,&local_1a0,&local_148,&continuationTracePtr);
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((local_1a0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:980:13)>
                   *)&local_1a0.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase957::run()::__4>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase957::run()::__4,void*&>
              (location_00,&local_1a0,&local_148,&continuationTracePtr);
    local_1a0.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_190.ptr = (PromiseNode *)0x0;
  local_180.ptr = (PromiseNode *)0x0;
  local_188.counter = (int *)location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_180);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_190);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1a0);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_138 = "run";
  local_130 = 0x3000003d4;
  Promise<void>::wait((Promise<void> *)&local_188,&waitScope);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_188);
  local_158 = counter == 4;
  continuationTracePtr = (void *)CONCAT44(continuationTracePtr._4_4_,4);
  local_168 = " == ";
  local_160 = 5;
  if (kj::_::Debug::minSeverity < 3 && !local_158) {
    local_190.ptr._0_4_ = 4;
    local_170 = (uint *)&counter;
    kj::_::Debug::log<char_const(&)[34],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3d8,ERROR,"\"failed: expected \" \"(4) == (counter)\", _kjCondition, 4, counter",
               (char (*) [34])"failed: expected (4) == (counter)",
               (DebugComparison<int,_int_&> *)&continuationTracePtr,(int *)&local_190,&counter);
  }
  local_170 = &errorHandler.exceptionCount;
  local_158 = errorHandler.exceptionCount == 1;
  continuationTracePtr = (void *)CONCAT44(continuationTracePtr._4_4_,1);
  local_168 = " == ";
  local_160 = 5;
  if ((!local_158) && (kj::_::Debug::minSeverity < 3)) {
    local_190.ptr._0_4_ = 1;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3d9,ERROR,
               "\"failed: expected \" \"(1u) == (errorHandler.exceptionCount)\", _kjCondition, 1u, errorHandler.exceptionCount"
               ,(char (*) [55])"failed: expected (1u) == (errorHandler.exceptionCount)",
               (DebugComparison<unsigned_int,_unsigned_int_&> *)&continuationTracePtr,
               (uint *)&local_190,local_170);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&ignore);
  TaskSet::~TaskSet(&tasks);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, TaskSet) {
  EventLoop loop;
  WaitScope waitScope(loop);
  ErrorHandlerImpl errorHandler;
  TaskSet tasks(errorHandler);

  int counter = 0;

  tasks.add(evalLater([&]() {
    EXPECT_EQ(0, counter++);
  }));
  tasks.add(evalLater([&]() {
    EXPECT_EQ(1, counter++);
    KJ_FAIL_ASSERT("example TaskSet failure") { break; }
  }));
  tasks.add(evalLater([&]() {
    EXPECT_EQ(2, counter++);
  }));

  auto ignore KJ_UNUSED = evalLater([&]() {
    KJ_FAIL_EXPECT("Promise without waiter shouldn't execute.");
  });

  evalLater([&]() {
    EXPECT_EQ(3, counter++);
  }).wait(waitScope);

  EXPECT_EQ(4, counter);
  EXPECT_EQ(1u, errorHandler.exceptionCount);
}